

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType2::AddValue(GridDataType2 *this,KFLOAT32 V)

{
  KFLOAT32 local_14;
  GridDataType2 *pGStack_10;
  KFLOAT32 V_local;
  GridDataType2 *this_local;
  
  *(short *)&(this->super_GridData).field_0xc = *(short *)&(this->super_GridData).field_0xc + 1;
  local_14 = V;
  pGStack_10 = this;
  std::vector<float,_std::allocator<float>_>::push_back
            (&this->m_vf32Values,(value_type_conflict6 *)&local_14);
  return;
}

Assistant:

void GridDataType2:: AddValue( KFLOAT32 V )
{
    ++m_ui16NumValues;
    m_vf32Values.push_back( V );
}